

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameTypes.cpp
# Opt level: O0

void __thiscall wasm::NameTypes::run(NameTypes *this,Module *module)

{
  __node_base_ptr *pp_Var1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  reference __k;
  ulong uVar7;
  char *pcVar8;
  size_type sVar9;
  Name local_178;
  Name local_168;
  Name local_158;
  undefined1 local_148 [8];
  string name;
  mapped_type *names;
  HeapType *type_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Name local_b0 [2];
  key_type *local_90;
  HeapType *type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  size_t i;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  used;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  Module *module_local;
  NameTypes *this_local;
  
  wasm::ModuleUtils::collectHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&used._M_h._M_single_bucket,
             module);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&i);
  __range2 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)0x0;
  pp_Var1 = &used._M_h._M_single_bucket;
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                     ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var1);
  type = (HeapType *)
         std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                   ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var1);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                *)&type);
    if (!bVar2) {
      pp_Var1 = &used._M_h._M_single_bucket;
      __end2_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var1);
      type_1 = (HeapType *)
               std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                 *)&type_1), bVar2) {
        __k = __gnu_cxx::
              __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
              ::operator*(&__end2_1);
        name.field_2._8_8_ =
             std::
             unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
             ::operator[](&module->typeNames,__k);
        IString::toString_abi_cxx11_((string *)local_148,(IString *)name.field_2._8_8_);
        while( true ) {
          uVar7 = std::__cxx11::string::size();
          bVar2 = false;
          if (1 < uVar7) {
            pcVar8 = (char *)std::__cxx11::string::back();
            iVar3 = isdigit((int)*pcVar8);
            bVar2 = iVar3 != 0;
          }
          if (!bVar2) break;
          std::__cxx11::string::pop_back();
        }
        uVar7 = std::__cxx11::string::size();
        if ((1 < uVar7) && (pcVar8 = (char *)std::__cxx11::string::back(), *pcVar8 == '_')) {
          std::__cxx11::string::pop_back();
          wasm::Name::Name(&local_158,(string *)local_148);
          sVar9 = std::
                  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                  ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)&i,&local_158);
          if (sVar9 == 0) {
            wasm::Name::Name(&local_168,(string *)local_148);
            wasm::Name::operator=((Name *)name.field_2._8_8_,&local_168);
            wasm::Name::Name(&local_178,(string *)local_148);
            std::
            unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)&i,&local_178);
          }
        }
        std::__cxx11::string::~string((string *)local_148);
        __gnu_cxx::
        __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
        ::operator++(&__end2_1);
      }
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)&i);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &used._M_h._M_single_bucket);
      return;
    }
    local_90 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2);
    sVar4 = std::
            unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
            ::count(&module->typeNames,local_90);
    if (sVar4 == 0) {
LAB_01ef4ddc:
      std::__cxx11::to_string(&local_f0,(unsigned_long)__range2);
      std::operator+(&local_d0,"type_",&local_f0);
      wasm::Name::Name(local_b0,&local_d0);
      pmVar5 = std::
               unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
               ::operator[](&module->typeNames,local_90);
      wasm::Name::operator=(&pmVar5->name,local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      __range2 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 ((long)&(__range2->
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1);
    }
    else {
      pmVar5 = std::
               unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
               ::operator[](&module->typeNames,local_90);
      sVar6 = IString::size((IString *)pmVar5);
      if (0x13 < sVar6) goto LAB_01ef4ddc;
    }
    pmVar5 = std::
             unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
             ::operator[](&module->typeNames,local_90);
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              *)&i,&pmVar5->name);
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void run(Module* module) override {
    // Find all the types.
    std::vector<HeapType> types = ModuleUtils::collectHeapTypes(*module);

    std::unordered_set<Name> used;

    // Ensure simple names. If a name already exists, and is short enough, keep
    // it.
    size_t i = 0;
    for (auto& type : types) {
      if (module->typeNames.count(type) == 0 ||
          module->typeNames[type].name.size() >= NameLenLimit) {
        module->typeNames[type].name = "type_" + std::to_string(i++);
      }
      used.insert(module->typeNames[type].name);
    }

    // "Lint" the names a little. In particular a name with a "_7" or such
    // suffix, as TypeSSA creates, can be removed if it does not cause a
    // collision. This keeps the names unique while removing 'noise.'
    //
    // Note we must iterate in a deterministic order here, so do it on |types|.
    for (auto& type : types) {
      auto& names = module->typeNames[type];
      std::string name = names.name.toString();
      while (name.size() > 1 && isdigit(name.back())) {
        name.pop_back();
      }
      if (name.size() > 1 && name.back() == '_') {
        name.pop_back();
        if (!used.count(name)) {
          names.name = name;
          used.insert(name);
        }
      }
    }
  }